

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O3

void __thiscall pbrt::ParallelForLoop1D::~ParallelForLoop1D(ParallelForLoop1D *this)

{
  _Manager_type p_Var1;
  
  (this->super_ParallelJob)._vptr_ParallelJob = (_func_int **)&PTR__ParallelForLoop1D_0309ce68;
  p_Var1 = (this->func).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->func,(_Any_data *)&this->func,__destroy_functor);
  }
  (this->super_ParallelJob)._vptr_ParallelJob = (_func_int **)&PTR__ParallelJob_0309cf28;
  return;
}

Assistant:

ParallelForLoop1D(int64_t start, int64_t end, int chunkSize,
                      std::function<void(int64_t, int64_t)> func)
        : func(std::move(func)), nextIndex(start), maxIndex(end), chunkSize(chunkSize) {}